

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O3

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  uint *puVar1;
  undefined8 uVar2;
  byte bVar3;
  uint uVar4;
  Verbosity VVar5;
  Tolerances *pTVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ostream *poVar8;
  ostream **ppoVar9;
  long lVar10;
  Real RVar11;
  double dVar12;
  char cVar13;
  undefined8 uVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  size_t sVar19;
  undefined7 in_register_00000009;
  Verbosity old_verbosity;
  Verbosity VVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  int iVar24;
  Verbosity old_verbosity_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  fpclass_type local_2d8;
  int32_t iStack_2d4;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_2b0;
  long local_298;
  long local_290;
  data_type local_288;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined5 local_258;
  char cStack_253;
  char cStack_252;
  undefined6 uStack_251;
  undefined3 uStack_24b;
  undefined5 uStack_248;
  undefined8 local_240;
  undefined1 local_238 [16];
  pointer local_228;
  uint auStack_220 [2];
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8;
  bool local_1f4;
  fpclass_type local_1f0;
  int32_t iStack_1ec;
  long local_1e0;
  data_type local_1d8;
  char local_1c3;
  char local_1c2;
  uint local_1b8;
  void *local_1b0;
  char local_1a3;
  char local_1a2;
  data_type local_198;
  char local_183;
  char local_182;
  uint local_178;
  void *local_170;
  char local_163;
  char local_162;
  pointer local_158;
  pointer pnStack_150;
  pointer local_148;
  uint auStack_140 [2];
  uint local_138 [2];
  uint auStack_130 [2];
  uint local_128 [2];
  uint auStack_120 [2];
  pointer local_118;
  pointer pnStack_110;
  pointer local_108;
  uint auStack_100 [2];
  uint local_f8 [2];
  uint auStack_f0 [2];
  uint local_e8 [2];
  uint auStack_e0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_290 = CONCAT44(local_290._4_4_,(int)CONCAT71(in_register_00000009,real));
  pTVar6 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var7 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
  dVar12 = log10(RVar11);
  iVar16 = (int)-dVar12;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  iVar24 = iVar16 + 10;
  if ((char)rownames != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase(&local_2b0,
                 (soplex->_realLP->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar15 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getPrimalRay(soplex,&local_2b0);
    if (bVar15) {
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
        (soplex->spxout).m_verbosity = VVar20;
      }
      if (0 < (soplex->_realLP->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_298 = (long)iVar16;
        lVar21 = 9;
        lVar23 = 0;
        do {
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2 + -0x12;
          local_118 = *(pointer *)puVar1;
          pnStack_110 = *(pointer *)(puVar1 + 2);
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2 + -0xe;
          local_108 = *(pointer *)puVar1;
          auStack_100 = *(uint (*) [2])(puVar1 + 2);
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2 + -10;
          local_f8 = *(uint (*) [2])puVar1;
          auStack_f0 = *(uint (*) [2])(puVar1 + 2);
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2 + -6;
          local_e8 = *(uint (*) [2])puVar1;
          auStack_e0 = *(uint (*) [2])(puVar1 + 2);
          uVar4 = ((local_2b0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                  [lVar21 * 2 + -2];
          bVar3 = (byte)((local_2b0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                        [lVar21 * 2 + -1];
          uVar2 = *(undefined8 *)
                   (((local_2b0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar21 * 2);
          pTVar6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
          local_208[0] = local_e8[0];
          local_208[1] = local_e8[1];
          auStack_200[0] = auStack_e0[0];
          auStack_200[1] = auStack_e0[1];
          local_218[0] = local_f8[0];
          local_218[1] = local_f8[1];
          auStack_210[0] = auStack_f0[0];
          auStack_210[1] = auStack_f0[1];
          local_228 = local_108;
          auStack_220[0] = auStack_100[0];
          auStack_220[1] = auStack_100[1];
          local_238._0_8_ = local_118;
          uVar14 = local_238._0_8_;
          local_238._8_8_ = pnStack_110;
          local_2d8 = (fpclass_type)uVar2;
          iStack_2d4 = (int32_t)((ulong)uVar2 >> 0x20);
          local_1f0 = local_2d8;
          iStack_1ec = iStack_2d4;
          local_1f4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_238._0_4_ = SUB84(local_118,0),
             local_238._0_4_ != 0 || local_2d8 != cpp_dec_float_finite)) {
            local_1f4 = (bool)(bVar3 ^ 1);
          }
          bVar15 = false;
          local_238._0_8_ = uVar14;
          local_1f8 = uVar4;
          if ((local_2d8 != cpp_dec_float_NaN) && (!NAN(RVar11))) {
            local_240 = 0x1000000000;
            local_288.double_first = 0;
            local_278 = (undefined1  [16])0x0;
            local_268 = (undefined1  [16])0x0;
            local_258 = 0;
            cStack_253 = '\0';
            cStack_252 = '\0';
            uStack_251 = 0;
            uStack_24b = 0;
            uStack_248 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_288.ld,RVar11);
            iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_238,
                                (cpp_dec_float<100U,_int,_void> *)&local_288.ld);
            bVar15 = 0 < iVar17;
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((bVar15) && (VVar20 = (soplex->spxout).m_verbosity, 2 < (int)VVar20)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar8 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
            }
            else {
              pcVar22 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
              sVar19 = strlen(pcVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar22,sVar19);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar5 = (soplex->spxout).m_verbosity;
            ppoVar9 = (soplex->spxout).m_streams;
            poVar8 = ppoVar9[VVar5];
            lVar10 = *(long *)poVar8;
            *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = (long)iVar24;
            *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = local_298;
            puVar1 = ((local_2b0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar21 * 2 + -0x12;
            local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = ((local_2b0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar21 * 2 + -0xe;
            local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = ((local_2b0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar21 * 2 + -10;
            local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = ((local_2b0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar21 * 2 + -6;
            local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
            local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
            local_88.m_backend.exp =
                 ((local_2b0.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                 [lVar21 * 2 + -2];
            local_88.m_backend.neg =
                 SUB41(((local_2b0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       [lVar21 * 2 + -1],0);
            puVar1 = ((local_2b0.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar21 * 2;
            local_88.m_backend.fpclass = puVar1[0];
            local_88.m_backend.prec_elem = puVar1[1];
            boost::multiprecision::operator<<(ppoVar9[VVar5],&local_88);
            poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar13 = (char)poVar8;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
            std::ostream::put(cVar13);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar20;
          }
          lVar23 = lVar23 + 1;
          lVar21 = lVar21 + 10;
        } while (lVar23 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar20 = (soplex->spxout).m_verbosity;
      }
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar21 + -0x18) + 8) = 1;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar8 + lVar21 + 0x18) = *(uint *)(poVar8 + lVar21 + 0x18) & 0xfffffefb | 0x100;
        pTVar6 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
        std::ostream::_M_insert<double>(RVar11);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar21 + -0x18) + 8) = 8;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar8 + lVar21 + 0x18) = *(uint *)(poVar8 + lVar21 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar13 = (char)poVar8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        (soplex->spxout).m_verbosity = VVar20;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 1) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0))))
            && (bVar15 = ::soplex::
                         SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::getPrimal(soplex,&local_2b0), bVar15)) {
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
        (soplex->spxout).m_verbosity = VVar20;
      }
      if ((soplex->_realLP->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum < 1) {
        iVar17 = 0;
      }
      else {
        local_298 = (long)iVar24;
        local_1e0 = (long)iVar16;
        lVar21 = 0;
        lVar23 = 9;
        iVar17 = 0;
        do {
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2 + -0x12;
          local_158 = *(pointer *)puVar1;
          pnStack_150 = *(pointer *)(puVar1 + 2);
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2 + -0xe;
          local_148 = *(pointer *)puVar1;
          auStack_140 = *(uint (*) [2])(puVar1 + 2);
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2 + -10;
          local_138 = *(uint (*) [2])puVar1;
          auStack_130 = *(uint (*) [2])(puVar1 + 2);
          puVar1 = ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2 + -6;
          local_128 = *(uint (*) [2])puVar1;
          auStack_120 = *(uint (*) [2])(puVar1 + 2);
          uVar4 = ((local_2b0.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                  [lVar23 * 2 + -2];
          bVar3 = (byte)((local_2b0.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                        [lVar23 * 2 + -1];
          uVar2 = *(undefined8 *)
                   (((local_2b0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar23 * 2);
          pTVar6 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
          RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
          local_208[0] = local_128[0];
          local_208[1] = local_128[1];
          auStack_200[0] = auStack_120[0];
          auStack_200[1] = auStack_120[1];
          local_218[0] = local_138[0];
          local_218[1] = local_138[1];
          auStack_210[0] = auStack_130[0];
          auStack_210[1] = auStack_130[1];
          local_228 = local_148;
          auStack_220[0] = auStack_140[0];
          auStack_220[1] = auStack_140[1];
          local_238._0_8_ = local_158;
          uVar14 = local_238._0_8_;
          local_238._8_8_ = pnStack_150;
          local_2d8 = (fpclass_type)uVar2;
          iStack_2d4 = (int32_t)((ulong)uVar2 >> 0x20);
          local_1f0 = local_2d8;
          iStack_1ec = iStack_2d4;
          local_1f4 = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_238._0_4_ = SUB84(local_158,0),
             local_238._0_4_ != 0 || local_2d8 != cpp_dec_float_finite)) {
            local_1f4 = (bool)(bVar3 ^ 1);
          }
          bVar15 = false;
          local_238._0_8_ = uVar14;
          local_1f8 = uVar4;
          if ((local_2d8 != cpp_dec_float_NaN) && (!NAN(RVar11))) {
            local_240 = 0x1000000000;
            local_288.double_first = 0;
            local_278 = (undefined1  [16])0x0;
            local_268 = (undefined1  [16])0x0;
            local_258 = 0;
            cStack_253 = '\0';
            cStack_252 = '\0';
            uStack_251 = 0;
            uStack_24b = 0;
            uStack_248 = 0;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&local_288.ld,RVar11);
            iVar18 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_238,
                                (cpp_dec_float<100U,_int,_void> *)&local_288.ld);
            bVar15 = 0 < iVar18;
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if (bVar15) {
            VVar20 = (soplex->spxout).m_verbosity;
            if (2 < (int)VVar20) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar8 = (soplex->spxout).m_streams[3];
              if (colnames->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
              }
              else {
                pcVar22 = colnames->mem +
                          (colnames->set).theitem[(colnames->set).thekey[lVar21].idx].data;
                sVar19 = strlen(pcVar22);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar22,sVar19);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar5 = (soplex->spxout).m_verbosity;
              ppoVar9 = (soplex->spxout).m_streams;
              poVar8 = ppoVar9[VVar5];
              lVar10 = *(long *)poVar8;
              *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = local_298;
              *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = local_1e0;
              puVar1 = ((local_2b0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar23 * 2 + -0x12;
              local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
              local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = ((local_2b0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar23 * 2 + -0xe;
              local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = ((local_2b0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar23 * 2 + -10;
              local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
              local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
              puVar1 = ((local_2b0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar23 * 2 + -6;
              local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
              local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
              local_d8.m_backend.exp =
                   ((local_2b0.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                   [lVar23 * 2 + -2];
              local_d8.m_backend.neg =
                   SUB41(((local_2b0.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                         [lVar23 * 2 + -1],0);
              puVar1 = ((local_2b0.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar23 * 2;
              local_d8.m_backend.fpclass = puVar1[0];
              local_d8.m_backend.prec_elem = puVar1[1];
              boost::multiprecision::operator<<(ppoVar9[VVar5],&local_d8);
              poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar13 = (char)poVar8;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
              std::ostream::put(cVar13);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar20;
            }
            iVar17 = iVar17 + 1;
          }
          lVar21 = lVar21 + 1;
          lVar23 = lVar23 + 10;
        } while (lVar21 < (soplex->_realLP->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
        VVar20 = (soplex->spxout).m_verbosity;
      }
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other variables are zero (within ",0x25);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar21 + -0x18) + 8) = 1;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar8 + lVar21 + 0x18) = *(uint *)(poVar8 + lVar21 + 0x18) & 0xfffffefb | 0x100;
        pTVar6 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        RVar11 = ::soplex::Tolerances::epsilon(pTVar6);
        std::ostream::_M_insert<double>(RVar11);
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar21 = *(long *)poVar8;
        *(undefined8 *)(poVar8 + *(long *)(lVar21 + -0x18) + 8) = 8;
        lVar21 = *(long *)(lVar21 + -0x18);
        *(uint *)(poVar8 + lVar21 + 0x18) = *(uint *)(poVar8 + lVar21 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"). Solution has ",0x10);
        std::ostream::operator<<
                  ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11
                  );
        poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar13 = (char)poVar8;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
        std::ostream::put(cVar13);
        std::ostream::flush();
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        goto LAB_0013a875;
      }
    }
    else {
      VVar20 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar20) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No primal information available.\n",0x21);
LAB_0013a875:
        (soplex->spxout).m_verbosity = VVar20;
      }
    }
    if (local_2b0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b0.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_290 == '\0') {
    return;
  }
  ::soplex::
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)local_238,
               (soplex->_realLP->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  bVar15 = ::soplex::
           SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ::getPrimalRayRational
                     (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)local_238);
  if (bVar15) {
    VVar20 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar20) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal ray (name, value):\n",0x1b);
      (soplex->spxout).m_verbosity = VVar20;
    }
    if (0 < (soplex->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum) {
      local_290 = (long)iVar24;
      lVar21 = 0;
      lVar23 = 0;
      do {
        uVar2 = local_238._0_8_;
        local_2b0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_288.ld,(longlong *)&local_2b0,(type *)0x0);
        iVar24 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                         *)uVar2)->m_value).num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar21),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_288.ld);
        if ((cStack_253 == '\0') && (cStack_252 == '\0')) {
          operator_delete((void *)local_268._8_8_,(ulong)(uint)local_268._0_4_ << 3);
        }
        if ((local_278[5] == '\0') && (local_278[6] == '\0')) {
          operator_delete(local_288.ld.data,(ulong)local_288.ld.capacity << 3);
        }
        if ((iVar24 != 0) && (VVar20 = (soplex->spxout).m_verbosity, 2 < (int)VVar20)) {
          (soplex->spxout).m_verbosity = INFO1;
          poVar8 = (soplex->spxout).m_streams[3];
          if (colnames->mem == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
          }
          else {
            pcVar22 = colnames->mem +
                      (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
            sVar19 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar22,sVar19);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
          poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          lVar10 = *(long *)poVar8;
          *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = local_290;
          *(long *)(poVar8 + *(long *)(lVar10 + -0x18) + 8) = (long)iVar16;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_198.ld,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)local_238._0_8_)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar21));
          boost::multiprecision::operator<<
                    ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)&local_198.ld);
          poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar13 = (char)poVar8;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
          std::ostream::put(cVar13);
          std::ostream::flush();
          if ((local_163 == '\0') && (local_162 == '\0')) {
            operator_delete(local_170,(ulong)local_178 << 3);
          }
          if ((local_183 == '\0') && (local_182 == '\0')) {
            operator_delete(local_198.ld.data,(ulong)local_198.ld.capacity << 3);
          }
          (soplex->spxout).m_verbosity = VVar20;
        }
        lVar23 = lVar23 + 1;
        lVar21 = lVar21 + 0x40;
      } while (lVar23 < (soplex->_realLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
      VVar20 = (soplex->spxout).m_verbosity;
    }
    if (2 < (int)VVar20) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
      poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
      cVar13 = (char)poVar8;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
      std::ostream::put(cVar13);
      std::ostream::flush();
      (soplex->spxout).m_verbosity = VVar20;
    }
  }
  if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xe0 & 1) != 0)) ||
      ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 1) != 0)))) &&
     (bVar15 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getPrimalRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                           *)local_238), bVar15)) {
    VVar20 = (soplex->spxout).m_verbosity;
    if (2 < (int)VVar20) {
      (soplex->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((soplex->spxout).m_streams[3],"\nPrimal solution (name, value):\n",0x20);
      (soplex->spxout).m_verbosity = VVar20;
    }
    if ((soplex->_rationalLP->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        .set.thenum < 1) {
      iVar16 = 0;
    }
    else {
      lVar21 = 0;
      lVar23 = 0;
      iVar16 = 0;
      do {
        uVar2 = local_238._0_8_;
        local_2b0.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_288.ld,(longlong *)&local_2b0,(type *)0x0);
        iVar24 = boost::multiprecision::backends::
                 rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                         *)uVar2)->m_value).num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar21),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)&local_288.ld);
        if ((cStack_253 == '\0') && (cStack_252 == '\0')) {
          operator_delete((void *)local_268._8_8_,(ulong)(uint)local_268._0_4_ << 3);
        }
        if ((local_278[5] == '\0') && (local_278[6] == '\0')) {
          operator_delete(local_288.ld.data,(ulong)local_288.ld.capacity << 3);
        }
        if (iVar24 != 0) {
          VVar20 = (soplex->spxout).m_verbosity;
          if (2 < (int)VVar20) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar8 = (soplex->spxout).m_streams[3];
            if (colnames->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar8 + -0x18) + (int)poVar8);
            }
            else {
              pcVar22 = colnames->mem +
                        (colnames->set).theitem[(colnames->set).thekey[lVar23].idx].data;
              sVar19 = strlen(pcVar22);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar22,sVar19);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_1d8.ld,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                             *)local_238._0_8_)->m_value).num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar21));
            boost::multiprecision::operator<<
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)&local_1d8.ld);
            poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar13 = (char)poVar8;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
            std::ostream::put(cVar13);
            std::ostream::flush();
            if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
              operator_delete(local_1b0,(ulong)local_1b8 << 3);
            }
            if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
              operator_delete(local_1d8.ld.data,(ulong)local_1d8.ld.capacity << 3);
            }
            (soplex->spxout).m_verbosity = VVar20;
          }
          iVar16 = iVar16 + 1;
        }
        lVar23 = lVar23 + 1;
        lVar21 = lVar21 + 0x40;
      } while (lVar23 < (soplex->_rationalLP->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        .set.thenum);
      VVar20 = (soplex->spxout).m_verbosity;
    }
    if ((int)VVar20 < 3) goto LAB_0013af98;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"All other variables are zero. Solution has ",0x2b);
    std::ostream::operator<<
              ((ostream *)(soplex->spxout).m_streams[(soplex->spxout).m_verbosity],iVar16);
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity]," nonzero entries.",0x11);
    poVar8 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
    cVar13 = (char)poVar8;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + cVar13);
    std::ostream::put(cVar13);
    std::ostream::flush();
  }
  else {
    VVar20 = (soplex->spxout).m_verbosity;
    if ((int)VVar20 < 3) goto LAB_0013af98;
    (soplex->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((soplex->spxout).m_streams[3],"No primal (rational) solution available.\n",0x29);
  }
  (soplex->spxout).m_verbosity = VVar20;
LAB_0013af98:
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             *)local_238);
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}